

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O3

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  int *piVar1;
  void *pvVar2;
  Arena *arena;
  int *piVar3;
  
  pvVar2 = internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)&(this->annotation_proto_->field_0)._impl_,
                      Arena::DefaultConstruct<google::protobuf::GeneratedCodeInfo_Annotation>);
  piVar3 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 != piVar1) {
    do {
      RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar2 + 0x18),*piVar3);
      piVar3 = piVar3 + 1;
    } while (piVar3 != piVar1);
  }
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  arena = *(Arena **)((long)pvVar2 + 8);
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>((ArenaStringPtr *)((long)pvVar2 + 0x30),file_path,arena);
  *(int *)((long)pvVar2 + 0x38) = (int)begin_offset;
  *(int *)((long)pvVar2 + 0x3c) = (int)end_offset;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 6;
  if (((ulong)semantic.
              super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
              _M_payload.
              super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> >>
       0x20 & 1) == 0) {
    return;
  }
  SetSemantic<google::protobuf::GeneratedCodeInfo_Annotation>
            (pvVar2,(ulong)semantic.
                           super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                    & 0xffffffff);
  return;
}

Assistant:

void AddAnnotation(size_t begin_offset, size_t end_offset,
                     const std::string& file_path, const std::vector<int>& path,
                     absl::optional<Semantic> semantic) override {
    auto* annotation = annotation_proto_->add_annotation();
    for (const int segment : path) {
      annotation->add_path(segment);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);

    if (semantic.has_value()) {
      SetSemantic(annotation, *semantic, Rank1{});
    }
  }